

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ssl_is_sct_list_valid(CBS *contents)

{
  bool bVar1;
  int iVar2;
  CBS sct_list;
  CBS copy;
  CBS sct;
  CBS CStack_48;
  CBS local_38;
  CBS local_20;
  
  local_38.data = contents->data;
  local_38.len = contents->len;
  iVar2 = CBS_get_u16_length_prefixed(&local_38,&CStack_48);
  bVar1 = false;
  if ((iVar2 != 0) && (local_38.len == 0)) {
    if (CStack_48.len == 0) {
      bVar1 = false;
    }
    else if (CStack_48.len == 0) {
      bVar1 = true;
    }
    else {
      do {
        iVar2 = CBS_get_u16_length_prefixed(&CStack_48,&local_20);
        bVar1 = local_20.len != 0 && iVar2 != 0;
        if (local_20.len == 0 || iVar2 == 0) {
          return bVar1;
        }
      } while (CStack_48.len != 0);
    }
  }
  return bVar1;
}

Assistant:

bool ssl_is_sct_list_valid(const CBS *contents) {
  // Shallow parse the SCT list for sanity. By the RFC
  // (https://tools.ietf.org/html/rfc6962#section-3.3) neither the list nor any
  // of the SCTs may be empty.
  CBS copy = *contents;
  CBS sct_list;
  if (!CBS_get_u16_length_prefixed(&copy, &sct_list) || CBS_len(&copy) != 0 ||
      CBS_len(&sct_list) == 0) {
    return false;
  }

  while (CBS_len(&sct_list) > 0) {
    CBS sct;
    if (!CBS_get_u16_length_prefixed(&sct_list, &sct) || CBS_len(&sct) == 0) {
      return false;
    }
  }

  return true;
}